

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O3

void __thiscall
cbtQuantizedBvh::deSerializeDouble
          (cbtQuantizedBvh *this,cbtQuantizedBvhDoubleData *quantizedBvhDoubleData)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  cbtOptimizedBvhNode *ptr;
  cbtOptimizedBvhNodeDoubleData *pcVar4;
  cbtQuantizedBvhNode *ptr_00;
  cbtQuantizedBvhNodeData *pcVar5;
  cbtBvhSubtreeInfo *ptr_01;
  cbtBvhSubtreeInfoData *pcVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  uint uVar15;
  cbtOptimizedBvhNode *pcVar16;
  cbtQuantizedBvhNode *pcVar17;
  cbtBvhSubtreeInfo *pcVar18;
  long lVar19;
  int *piVar20;
  long lVar21;
  
  auVar7 = vcvtpd2ps_avx(*(undefined1 (*) [32])(quantizedBvhDoubleData->m_bvhAabbMax).m_floats);
  *(undefined1 (*) [16])(this->m_bvhAabbMax).m_floats = auVar7;
  auVar7 = vcvtpd2ps_avx(*(undefined1 (*) [32])(quantizedBvhDoubleData->m_bvhAabbMin).m_floats);
  *(undefined1 (*) [16])(this->m_bvhAabbMin).m_floats = auVar7;
  auVar7 = vcvtpd2ps_avx(*(undefined1 (*) [32])(quantizedBvhDoubleData->m_bvhQuantization).m_floats)
  ;
  *(undefined1 (*) [16])(this->m_bvhQuantization).m_floats = auVar7;
  this->m_curNodeIndex = quantizedBvhDoubleData->m_curNodeIndex;
  this->m_useQuantization = quantizedBvhDoubleData->m_useQuantization != 0;
  uVar3 = quantizedBvhDoubleData->m_numContiguousLeafNodes;
  uVar15 = (this->m_contiguousNodes).m_size;
  if ((int)uVar15 < (int)uVar3) {
    lVar21 = (long)(int)uVar15;
    if ((this->m_contiguousNodes).m_capacity < (int)uVar3) {
      if (uVar3 == 0) {
        pcVar16 = (cbtOptimizedBvhNode *)0x0;
      }
      else {
        pcVar16 = (cbtOptimizedBvhNode *)cbtAlignedAllocInternal((long)(int)uVar3 << 6,0x10);
        uVar15 = (this->m_contiguousNodes).m_size;
      }
      if (0 < (int)uVar15) {
        lVar19 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)(((this->m_contiguousNodes).m_data)->m_aabbMinOrg).m_floats + lVar19);
          uVar8 = puVar1[1];
          uVar9 = puVar1[2];
          uVar10 = puVar1[3];
          uVar11 = puVar1[4];
          uVar12 = puVar1[5];
          uVar13 = puVar1[6];
          uVar14 = puVar1[7];
          puVar2 = (undefined8 *)((long)(pcVar16->m_aabbMinOrg).m_floats + lVar19);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          puVar2[2] = uVar9;
          puVar2[3] = uVar10;
          puVar2[4] = uVar11;
          puVar2[5] = uVar12;
          puVar2[6] = uVar13;
          puVar2[7] = uVar14;
          lVar19 = lVar19 + 0x40;
        } while ((ulong)uVar15 << 6 != lVar19);
      }
      ptr = (this->m_contiguousNodes).m_data;
      if ((ptr != (cbtOptimizedBvhNode *)0x0) && ((this->m_contiguousNodes).m_ownsMemory == true)) {
        cbtAlignedFreeInternal(ptr);
      }
      (this->m_contiguousNodes).m_ownsMemory = true;
      (this->m_contiguousNodes).m_data = pcVar16;
      (this->m_contiguousNodes).m_capacity = uVar3;
    }
    lVar19 = (int)uVar3 - lVar21;
    lVar21 = lVar21 << 6;
    do {
      puVar1 = (undefined8 *)
               ((long)(((this->m_contiguousNodes).m_data)->m_aabbMinOrg).m_floats + lVar21);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[2] = 0;
      puVar1[3] = 0;
      puVar1[4] = 0;
      puVar1[5] = 0;
      puVar1[6] = 0;
      puVar1[7] = 0;
      lVar21 = lVar21 + 0x40;
      lVar19 = lVar19 + -1;
    } while (lVar19 != 0);
  }
  (this->m_contiguousNodes).m_size = uVar3;
  if (0 < (int)uVar3) {
    pcVar4 = quantizedBvhDoubleData->m_contiguousNodesPtr;
    lVar21 = 0;
    piVar20 = &((this->m_contiguousNodes).m_data)->m_triangleIndex;
    do {
      auVar7 = vcvtpd2ps_avx(*(undefined1 (*) [32])((long)(pcVar4->m_aabbMaxOrg).m_floats + lVar21))
      ;
      *(undefined1 (*) [16])((cbtVector3 *)(piVar20 + -6))->m_floats = auVar7;
      auVar7 = vcvtpd2ps_avx(*(undefined1 (*) [32])((long)(pcVar4->m_aabbMinOrg).m_floats + lVar21))
      ;
      *(undefined1 (*) [16])(((cbtOptimizedBvhNode *)(piVar20 + -10))->m_aabbMinOrg).m_floats =
           auVar7;
      *(undefined8 *)(piVar20 + -2) = *(undefined8 *)(pcVar4->m_pad + lVar21 + -0xc);
      lVar19 = lVar21 + -4;
      lVar21 = lVar21 + 0x50;
      *piVar20 = *(int *)(pcVar4->m_pad + lVar19);
      piVar20 = piVar20 + 0x10;
    } while ((ulong)uVar3 * 0x50 != lVar21);
  }
  uVar3 = quantizedBvhDoubleData->m_numQuantizedContiguousNodes;
  uVar15 = (this->m_quantizedContiguousNodes).m_size;
  if ((int)uVar15 < (int)uVar3) {
    lVar21 = (long)(int)uVar15;
    if ((this->m_quantizedContiguousNodes).m_capacity < (int)uVar3) {
      if (uVar3 == 0) {
        pcVar17 = (cbtQuantizedBvhNode *)0x0;
      }
      else {
        pcVar17 = (cbtQuantizedBvhNode *)cbtAlignedAllocInternal((long)(int)uVar3 << 4,0x10);
        uVar15 = (this->m_quantizedContiguousNodes).m_size;
      }
      if (0 < (int)uVar15) {
        lVar19 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)((this->m_quantizedContiguousNodes).m_data)->m_quantizedAabbMin + lVar19);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)((long)pcVar17->m_quantizedAabbMin + lVar19);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          lVar19 = lVar19 + 0x10;
        } while ((ulong)uVar15 << 4 != lVar19);
      }
      ptr_00 = (this->m_quantizedContiguousNodes).m_data;
      if ((ptr_00 != (cbtQuantizedBvhNode *)0x0) &&
         ((this->m_quantizedContiguousNodes).m_ownsMemory == true)) {
        cbtAlignedFreeInternal(ptr_00);
      }
      (this->m_quantizedContiguousNodes).m_ownsMemory = true;
      (this->m_quantizedContiguousNodes).m_data = pcVar17;
      (this->m_quantizedContiguousNodes).m_capacity = uVar3;
    }
    lVar19 = (int)uVar3 - lVar21;
    lVar21 = lVar21 << 4;
    do {
      puVar1 = (undefined8 *)
               ((long)((this->m_quantizedContiguousNodes).m_data)->m_quantizedAabbMin + lVar21);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar21 = lVar21 + 0x10;
      lVar19 = lVar19 + -1;
    } while (lVar19 != 0);
  }
  (this->m_quantizedContiguousNodes).m_size = uVar3;
  if (0 < (int)uVar3) {
    pcVar5 = quantizedBvhDoubleData->m_quantizedContiguousNodesPtr;
    pcVar17 = (this->m_quantizedContiguousNodes).m_data;
    lVar21 = 0;
    do {
      *(undefined4 *)((long)pcVar17->m_quantizedAabbMax + lVar21 + 6) =
           *(undefined4 *)((long)pcVar5->m_quantizedAabbMax + lVar21 + 6);
      *(undefined2 *)((long)pcVar17->m_quantizedAabbMax + lVar21) =
           *(undefined2 *)((long)pcVar5->m_quantizedAabbMax + lVar21);
      *(undefined2 *)((long)pcVar17->m_quantizedAabbMax + lVar21 + 2) =
           *(undefined2 *)((long)pcVar5->m_quantizedAabbMax + lVar21 + 2);
      *(undefined2 *)((long)pcVar17->m_quantizedAabbMax + lVar21 + 4) =
           *(undefined2 *)((long)pcVar5->m_quantizedAabbMax + lVar21 + 4);
      *(undefined2 *)((long)pcVar17->m_quantizedAabbMin + lVar21) =
           *(undefined2 *)((long)pcVar5->m_quantizedAabbMin + lVar21);
      *(undefined2 *)((long)pcVar17->m_quantizedAabbMin + lVar21 + 2) =
           *(undefined2 *)((long)pcVar5->m_quantizedAabbMin + lVar21 + 2);
      *(undefined2 *)((long)pcVar17->m_quantizedAabbMin + lVar21 + 4) =
           *(undefined2 *)((long)pcVar5->m_quantizedAabbMin + lVar21 + 4);
      lVar21 = lVar21 + 0x10;
    } while ((ulong)uVar3 << 4 != lVar21);
  }
  this->m_traversalMode = quantizedBvhDoubleData->m_traversalMode;
  uVar3 = quantizedBvhDoubleData->m_numSubtreeHeaders;
  uVar15 = (this->m_SubtreeHeaders).m_size;
  if (((int)uVar15 < (int)uVar3) && ((this->m_SubtreeHeaders).m_capacity < (int)uVar3)) {
    if (uVar3 == 0) {
      pcVar18 = (cbtBvhSubtreeInfo *)0x0;
    }
    else {
      pcVar18 = (cbtBvhSubtreeInfo *)cbtAlignedAllocInternal((long)(int)uVar3 << 5,0x10);
      uVar15 = (this->m_SubtreeHeaders).m_size;
    }
    if (0 < (int)uVar15) {
      lVar21 = 0;
      do {
        puVar1 = (undefined8 *)
                 ((long)((this->m_SubtreeHeaders).m_data)->m_quantizedAabbMin + lVar21);
        uVar8 = puVar1[1];
        uVar9 = puVar1[2];
        uVar10 = puVar1[3];
        puVar2 = (undefined8 *)((long)pcVar18->m_quantizedAabbMin + lVar21);
        *puVar2 = *puVar1;
        puVar2[1] = uVar8;
        puVar2[2] = uVar9;
        puVar2[3] = uVar10;
        lVar21 = lVar21 + 0x20;
      } while ((ulong)uVar15 << 5 != lVar21);
    }
    ptr_01 = (this->m_SubtreeHeaders).m_data;
    if ((ptr_01 != (cbtBvhSubtreeInfo *)0x0) && ((this->m_SubtreeHeaders).m_ownsMemory == true)) {
      cbtAlignedFreeInternal(ptr_01);
    }
    (this->m_SubtreeHeaders).m_ownsMemory = true;
    (this->m_SubtreeHeaders).m_data = pcVar18;
    (this->m_SubtreeHeaders).m_capacity = uVar3;
  }
  (this->m_SubtreeHeaders).m_size = uVar3;
  if (0 < (int)uVar3) {
    pcVar6 = quantizedBvhDoubleData->m_subTreeInfoPtr;
    lVar21 = 0;
    piVar20 = &((this->m_SubtreeHeaders).m_data)->m_rootNodeIndex;
    do {
      *(unsigned_short *)((long)piVar20 + -6) =
           *(unsigned_short *)((long)pcVar6->m_quantizedAabbMax + lVar21);
      *(unsigned_short *)(piVar20 + -1) =
           *(unsigned_short *)((long)pcVar6->m_quantizedAabbMax + lVar21 + 2);
      *(unsigned_short *)((long)piVar20 + -2) =
           *(unsigned_short *)((long)pcVar6->m_quantizedAabbMax + lVar21 + 4);
      ((cbtBvhSubtreeInfo *)(piVar20 + -3))->m_quantizedAabbMin[0] =
           *(unsigned_short *)((long)pcVar6->m_quantizedAabbMin + lVar21);
      *(unsigned_short *)((long)piVar20 + -10) =
           *(unsigned_short *)((long)pcVar6->m_quantizedAabbMin + lVar21 + 2);
      *(unsigned_short *)(piVar20 + -2) =
           *(unsigned_short *)((long)pcVar6->m_quantizedAabbMin + lVar21 + 4);
      lVar19 = lVar21 + -8;
      lVar21 = lVar21 + 0x14;
      *(undefined8 *)piVar20 = *(undefined8 *)((long)pcVar6->m_quantizedAabbMin + lVar19);
      piVar20 = piVar20 + 8;
    } while ((ulong)uVar3 * 0x14 != lVar21);
  }
  return;
}

Assistant:

void cbtQuantizedBvh::deSerializeDouble(struct cbtQuantizedBvhDoubleData& quantizedBvhDoubleData)
{
	m_bvhAabbMax.deSerializeDouble(quantizedBvhDoubleData.m_bvhAabbMax);
	m_bvhAabbMin.deSerializeDouble(quantizedBvhDoubleData.m_bvhAabbMin);
	m_bvhQuantization.deSerializeDouble(quantizedBvhDoubleData.m_bvhQuantization);

	m_curNodeIndex = quantizedBvhDoubleData.m_curNodeIndex;
	m_useQuantization = quantizedBvhDoubleData.m_useQuantization != 0;

	{
		int numElem = quantizedBvhDoubleData.m_numContiguousLeafNodes;
		m_contiguousNodes.resize(numElem);

		if (numElem)
		{
			cbtOptimizedBvhNodeDoubleData* memPtr = quantizedBvhDoubleData.m_contiguousNodesPtr;

			for (int i = 0; i < numElem; i++, memPtr++)
			{
				m_contiguousNodes[i].m_aabbMaxOrg.deSerializeDouble(memPtr->m_aabbMaxOrg);
				m_contiguousNodes[i].m_aabbMinOrg.deSerializeDouble(memPtr->m_aabbMinOrg);
				m_contiguousNodes[i].m_escapeIndex = memPtr->m_escapeIndex;
				m_contiguousNodes[i].m_subPart = memPtr->m_subPart;
				m_contiguousNodes[i].m_triangleIndex = memPtr->m_triangleIndex;
			}
		}
	}

	{
		int numElem = quantizedBvhDoubleData.m_numQuantizedContiguousNodes;
		m_quantizedContiguousNodes.resize(numElem);

		if (numElem)
		{
			cbtQuantizedBvhNodeData* memPtr = quantizedBvhDoubleData.m_quantizedContiguousNodesPtr;
			for (int i = 0; i < numElem; i++, memPtr++)
			{
				m_quantizedContiguousNodes[i].m_escapeIndexOrTriangleIndex = memPtr->m_escapeIndexOrTriangleIndex;
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[0] = memPtr->m_quantizedAabbMax[0];
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[1] = memPtr->m_quantizedAabbMax[1];
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[2] = memPtr->m_quantizedAabbMax[2];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[0] = memPtr->m_quantizedAabbMin[0];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[1] = memPtr->m_quantizedAabbMin[1];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[2] = memPtr->m_quantizedAabbMin[2];
			}
		}
	}

	m_traversalMode = cbtTraversalMode(quantizedBvhDoubleData.m_traversalMode);

	{
		int numElem = quantizedBvhDoubleData.m_numSubtreeHeaders;
		m_SubtreeHeaders.resize(numElem);
		if (numElem)
		{
			cbtBvhSubtreeInfoData* memPtr = quantizedBvhDoubleData.m_subTreeInfoPtr;
			for (int i = 0; i < numElem; i++, memPtr++)
			{
				m_SubtreeHeaders[i].m_quantizedAabbMax[0] = memPtr->m_quantizedAabbMax[0];
				m_SubtreeHeaders[i].m_quantizedAabbMax[1] = memPtr->m_quantizedAabbMax[1];
				m_SubtreeHeaders[i].m_quantizedAabbMax[2] = memPtr->m_quantizedAabbMax[2];
				m_SubtreeHeaders[i].m_quantizedAabbMin[0] = memPtr->m_quantizedAabbMin[0];
				m_SubtreeHeaders[i].m_quantizedAabbMin[1] = memPtr->m_quantizedAabbMin[1];
				m_SubtreeHeaders[i].m_quantizedAabbMin[2] = memPtr->m_quantizedAabbMin[2];
				m_SubtreeHeaders[i].m_rootNodeIndex = memPtr->m_rootNodeIndex;
				m_SubtreeHeaders[i].m_subtreeSize = memPtr->m_subtreeSize;
			}
		}
	}
}